

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBrake.cpp
# Opt level: O2

void __thiscall chrono::ChLinkBrake::ArchiveOUT(ChLinkBrake *this,ChArchiveOut *marchive)

{
  ChNameValue<int> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkBrake>(marchive);
  ChLinkLock::ArchiveOUT(&this->super_ChLinkLock,marchive);
  local_30._value = &this->brake_torque;
  local_30._name = "brake_torque";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->stick_ratio;
  local_48._name = "stick_ratio";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->brake_mode;
  local_60._name = "brake_mode";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChLinkBrake::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkBrake>();

    // serialize parent class
    ChLinkLock::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(brake_torque);
    marchive << CHNVP(stick_ratio);
    marchive << CHNVP(brake_mode);
}